

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void searchlight_caught(tgestate_t *state,searchlight_movement_t *slstate)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  bVar3 = (state->map_position).x;
  bVar1 = (slstate->xy).x;
  if ((bVar3 <= bVar1) && (bVar1 + 5 < bVar3 + 0xc)) {
    bVar3 = (slstate->xy).y;
    bVar2 = (state->map_position).y;
    if ((bVar3 + 5 < bVar2 + 10) &&
       ((bVar2 + 6 < bVar3 + 0xc && (state->searchlight_state != '\x1f')))) {
      state->searchlight_state = '\x1f';
      (state->searchlight).caught_coord.y = bVar3;
      (state->searchlight).caught_coord.x = bVar1;
      state->bell = '\0';
      bVar3 = 10;
      if (10 < state->morale) {
        bVar3 = state->morale;
      }
      state->morale = bVar3 - 10;
    }
  }
  return;
}

Assistant:

void searchlight_caught(tgestate_t                   *state,
                        const searchlight_movement_t *slstate)
{
  uint8_t mappos_y, mappos_x; /* was D,E */
  uint8_t y, x;

  assert(state   != NULL);
  assert(slstate != NULL);

  /* Note that this code can get hit even when the hero is in bed... */

  mappos_y = state->map_position.y;
  mappos_x = state->map_position.x;
  x        = slstate->xy.x;
  y        = slstate->xy.y;

  if (x + 5 >= mappos_x + 12 || x + 10 <  mappos_x + 10 ||
      y + 5 >= mappos_y + 10 || y + 12 <= mappos_y + 6)
    return;

  /* It seems odd to not do this (cheaper) test sooner. */
  if (state->searchlight_state == searchlight_STATE_CAUGHT)
    return; /* already caught */

  state->searchlight_state = searchlight_STATE_CAUGHT;

  state->searchlight.caught_coord.y = slstate->xy.y;
  state->searchlight.caught_coord.x = slstate->xy.x;

  state->bell = bell_RING_PERPETUAL;

  decrease_morale(state, 10); /* was tail call */
}